

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void * rw::ps2::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  uint local_34;
  uint32 i;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 4)) {
    lVar1 = *(long *)((long)object + 0x98);
    for (local_34 = 0; local_34 < *(uint *)(lVar1 + 4); local_34 = local_34 + 1) {
      (*DAT_00168638)(*(undefined8 *)(*(long *)(lVar1 + 8) + (ulong)local_34 * 0x20 + 8));
    }
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 8));
    (*DAT_00168638)(lVar1);
    *(undefined8 *)((long)object + 0x98) = 0;
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return object;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++)
		rwFree(header->instanceMeshes[i].dataRaw);
	rwFree(header->instanceMeshes);
	rwFree(header);
	geometry->instData = nil;
	return object;
}